

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

void __thiscall
google::protobuf::RepeatedField<unsigned_long>::CopyFrom
          (RepeatedField<unsigned_long> *this,RepeatedField<unsigned_long> *other)

{
  RepeatedField<unsigned_long> *in_RSI;
  RepeatedField<unsigned_long> *in_RDI;
  RepeatedField<unsigned_long> *in_stack_00000068;
  RepeatedField<unsigned_long> *in_stack_00000070;
  
  if (in_RSI != in_RDI) {
    Clear(in_RDI);
    MergeFrom(in_stack_00000070,in_stack_00000068);
  }
  return;
}

Assistant:

inline void RepeatedField<Element>::CopyFrom(const RepeatedField& other) {
  if (&other == this) return;
  Clear();
  MergeFrom(other);
}